

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceHPoint.cpp
# Opt level: O0

HPoint * __thiscall IceMaths::HPoint::operator*=(HPoint *this,Matrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float wp;
  float zp;
  float yp;
  float xp;
  Matrix4x4 *mat_local;
  HPoint *this_local;
  
  fVar1 = (this->super_Point).x;
  fVar2 = mat->m[0][1];
  fVar3 = mat->m[1][1];
  fVar4 = mat->m[2][1];
  fVar5 = this->w;
  fVar6 = mat->m[3][1];
  fVar7 = (this->super_Point).x;
  fVar8 = mat->m[0][2];
  fVar9 = (this->super_Point).y;
  fVar10 = mat->m[1][2];
  fVar11 = mat->m[2][2];
  fVar12 = this->w;
  fVar13 = mat->m[3][2];
  fVar14 = (this->super_Point).x;
  fVar15 = mat->m[0][3];
  fVar16 = (this->super_Point).y;
  fVar17 = mat->m[1][3];
  fVar18 = (this->super_Point).z;
  fVar19 = mat->m[2][3];
  fVar20 = this->w;
  fVar21 = mat->m[3][3];
  (this->super_Point).x =
       this->w * mat->m[3][0] +
       (this->super_Point).z * mat->m[2][0] +
       (this->super_Point).x * mat->m[0][0] + (this->super_Point).y * mat->m[1][0];
  (this->super_Point).y =
       fVar5 * fVar6 + (this->super_Point).z * fVar4 + fVar1 * fVar2 + (this->super_Point).y * fVar3
  ;
  (this->super_Point).z =
       fVar12 * fVar13 + (this->super_Point).z * fVar11 + fVar7 * fVar8 + fVar9 * fVar10;
  this->w = fVar20 * fVar21 + fVar18 * fVar19 + fVar14 * fVar15 + fVar16 * fVar17;
  return this;
}

Assistant:

HPoint& HPoint::operator*=(const Matrix4x4& mat)
{
	float xp = x * mat.m[0][0] + y * mat.m[1][0] + z * mat.m[2][0] + w * mat.m[3][0];
	float yp = x * mat.m[0][1] + y * mat.m[1][1] + z * mat.m[2][1] + w * mat.m[3][1];
	float zp = x * mat.m[0][2] + y * mat.m[1][2] + z * mat.m[2][2] + w * mat.m[3][2];
	float wp = x * mat.m[0][3] + y * mat.m[1][3] + z * mat.m[2][3] + w * mat.m[3][3];

	x = xp; y = yp; z = zp; w = wp;

	return	*this;
}